

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

DecompressResult
tcu::astc::anon_unknown_0::decompressBlock
          (void *dst,Block128 *blockData,int blockWidth,int blockHeight,bool isSRGB,bool isLDR)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int numPartitions_00;
  int numValuesInSequence;
  deInt32 dVar4;
  bool bVar5;
  deUint32 local_628;
  deUint32 local_624;
  ColorEndpointPair *local_5f0;
  uint local_5e0;
  uint local_5dc;
  uint local_5d8;
  int local_5d0;
  int local_5cc;
  deUint32 partitionIndexSeed;
  int ccs;
  TexelWeightPair texelWeights [144];
  ISEParams local_120;
  undefined1 local_118 [8];
  ColorEndpointPair colorEndpoints [4];
  int numColorEndpointValues;
  deUint32 colorEndpointModes [4];
  int extraCemBitsStart;
  int numBitsForColorEndpoints;
  int numConfigDataBits;
  bool isSingleUniqueCem;
  int numPartitions;
  int numWeightDataBits;
  int numWeights;
  ASTCBlockMode blockMode;
  bool isLDR_local;
  bool isSRGB_local;
  int blockHeight_local;
  int blockWidth_local;
  Block128 *blockData_local;
  void *dst_local;
  
  blockMode.weightISEParams.mode._2_1_ = isLDR;
  blockMode.weightISEParams.mode._3_1_ = isSRGB;
  blockMode.weightISEParams.numBits = blockHeight;
  dVar1 = Block128::getBits(blockData,0,10);
  getASTCBlockMode((ASTCBlockMode *)&numWeightDataBits,dVar1);
  if (((byte)numWeightDataBits & 1) == 0) {
    if ((numWeightDataBits._1_1_ & 1) == 0) {
      iVar2 = computeNumWeights((ASTCBlockMode *)&numWeightDataBits);
      iVar3 = computeNumRequiredBits((ISEParams *)&blockMode.weightGridWidth,iVar2);
      dVar1 = Block128::getBits(blockData,0xb,0xc);
      numPartitions_00 = dVar1 + 1;
      if (((((iVar2 < 0x41) && (iVar3 < 0x61)) && (0x17 < iVar3)) &&
          ((numWeights <= blockWidth && ((int)blockMode._0_4_ <= blockMode.weightISEParams.numBits))
          )) && ((numPartitions_00 != 4 || ((numWeightDataBits._2_1_ & 1) == 0)))) {
        bVar5 = true;
        if (numPartitions_00 == 1) {
          local_5cc = 0x11;
        }
        else {
          dVar1 = Block128::getBits(blockData,0x17,0x18);
          bVar5 = dVar1 == 0;
          if (bVar5) {
            local_5d0 = 0x1d;
          }
          else {
            local_5d0 = numPartitions_00 * 3 + 0x19;
          }
          local_5cc = local_5d0;
        }
        iVar2 = 0;
        if ((numWeightDataBits._2_1_ & 1) != 0) {
          iVar2 = 2;
        }
        iVar2 = (0x80 - iVar3) - (local_5cc + iVar2);
        if (bVar5) {
          local_5d8 = 0xffffffff;
        }
        else {
          if (numPartitions_00 == 4) {
            local_5dc = 7;
          }
          else {
            if (numPartitions_00 == 3) {
              local_5e0 = 4;
            }
            else {
              local_5e0 = (uint)(numPartitions_00 == 2);
            }
            local_5dc = local_5e0;
          }
          local_5d8 = local_5dc;
        }
        iVar3 = (0x7f - iVar3) - local_5d8;
        decodeColorEndpointModes
                  ((deUint32 *)&stack0xffffffffffffff78,blockData,numPartitions_00,iVar3);
        numValuesInSequence =
             computeNumColorEndpointValues((deUint32 *)&stack0xffffffffffffff78,numPartitions_00);
        if ((numValuesInSequence < 0x13) &&
           (dVar4 = deDivRoundUp32(numValuesInSequence * 0xd,5), dVar4 <= iVar2)) {
          local_5f0 = (ColorEndpointPair *)local_118;
          do {
            ColorEndpointPair::ColorEndpointPair(local_5f0);
            local_5f0 = local_5f0 + 1;
          } while (local_5f0 != (ColorEndpointPair *)(colorEndpoints[3].e1.m_data + 2));
          local_120 = computeMaximumRangeISEParams(iVar2,numValuesInSequence);
          computeColorEndpoints
                    ((ColorEndpointPair *)local_118,blockData,(deUint32 *)&stack0xffffffffffffff78,
                     numPartitions_00,numValuesInSequence,&local_120,iVar2);
          computeTexelWeights((TexelWeightPair *)&partitionIndexSeed,blockData,blockWidth,
                              blockMode.weightISEParams.numBits,(ASTCBlockMode *)&numWeightDataBits)
          ;
          if ((numWeightDataBits._2_1_ & 1) == 0) {
            local_624 = 0xffffffff;
          }
          else {
            local_624 = Block128::getBits(blockData,iVar3 + -2,iVar3 + -1);
          }
          if (numPartitions_00 < 2) {
            local_628 = 0xffffffff;
          }
          else {
            local_628 = Block128::getBits(blockData,0xd,0x16);
          }
          dst_local._4_4_ =
               setTexelColors(dst,(ColorEndpointPair *)local_118,
                              (TexelWeightPair *)&partitionIndexSeed,local_624,local_628,
                              numPartitions_00,blockWidth,blockMode.weightISEParams.numBits,
                              (bool)(blockMode.weightISEParams.mode._3_1_ & 1),
                              (bool)(blockMode.weightISEParams.mode._2_1_ & 1),
                              (deUint32 *)&stack0xffffffffffffff78);
        }
        else {
          setASTCErrorColorBlock
                    (dst,blockWidth,blockMode.weightISEParams.numBits,
                     (bool)(blockMode.weightISEParams.mode._3_1_ & 1));
          dst_local._4_4_ = DECOMPRESS_RESULT_ERROR;
        }
      }
      else {
        setASTCErrorColorBlock
                  (dst,blockWidth,blockMode.weightISEParams.numBits,
                   (bool)(blockMode.weightISEParams.mode._3_1_ & 1));
        dst_local._4_4_ = DECOMPRESS_RESULT_ERROR;
      }
    }
    else {
      dst_local._4_4_ =
           decodeVoidExtentBlock
                     (dst,blockData,blockWidth,blockMode.weightISEParams.numBits,
                      (bool)(blockMode.weightISEParams.mode._3_1_ & 1),
                      (bool)(blockMode.weightISEParams.mode._2_1_ & 1));
    }
  }
  else {
    setASTCErrorColorBlock
              (dst,blockWidth,blockMode.weightISEParams.numBits,
               (bool)(blockMode.weightISEParams.mode._3_1_ & 1));
    dst_local._4_4_ = DECOMPRESS_RESULT_ERROR;
  }
  return dst_local._4_4_;
}

Assistant:

DecompressResult decompressBlock (void* dst, const Block128& blockData, int blockWidth, int blockHeight, bool isSRGB, bool isLDR)
{
	DE_ASSERT(isLDR || !isSRGB);

	// Decode block mode.

	const ASTCBlockMode blockMode = getASTCBlockMode(blockData.getBits(0, 10));

	// Check for block mode errors.

	if (blockMode.isError)
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Separate path for void-extent.

	if (blockMode.isVoidExtent)
		return decodeVoidExtentBlock(dst, blockData, blockWidth, blockHeight, isSRGB, isLDR);

	// Compute weight grid values.

	const int numWeights			= computeNumWeights(blockMode);
	const int numWeightDataBits		= computeNumRequiredBits(blockMode.weightISEParams, numWeights);
	const int numPartitions			= (int)blockData.getBits(11, 12) + 1;

	// Check for errors in weight grid, partition and dual-plane parameters.

	if (numWeights > 64								||
		numWeightDataBits > 96						||
		numWeightDataBits < 24						||
		blockMode.weightGridWidth > blockWidth		||
		blockMode.weightGridHeight > blockHeight	||
		(numPartitions == 4 && blockMode.isDualPlane))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute number of bits available for color endpoint data.

	const bool	isSingleUniqueCem			= numPartitions == 1 || blockData.getBits(23, 24) == 0;
	const int	numConfigDataBits			= (numPartitions == 1 ? 17 : isSingleUniqueCem ? 29 : 25 + 3*numPartitions) +
											  (blockMode.isDualPlane ? 2 : 0);
	const int	numBitsForColorEndpoints	= 128 - numWeightDataBits - numConfigDataBits;
	const int	extraCemBitsStart			= 127 - numWeightDataBits - (isSingleUniqueCem		? -1
																		: numPartitions == 4	? 7
																		: numPartitions == 3	? 4
																		: numPartitions == 2	? 1
																		: 0);
	// Decode color endpoint modes.

	deUint32 colorEndpointModes[4];
	decodeColorEndpointModes(&colorEndpointModes[0], blockData, numPartitions, extraCemBitsStart);

	const int numColorEndpointValues = computeNumColorEndpointValues(colorEndpointModes, numPartitions);

	// Check for errors in color endpoint value count.

	if (numColorEndpointValues > 18 || numBitsForColorEndpoints < deDivRoundUp32(13*numColorEndpointValues, 5))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	// Compute color endpoints.

	ColorEndpointPair colorEndpoints[4];
	computeColorEndpoints(&colorEndpoints[0], blockData, &colorEndpointModes[0], numPartitions, numColorEndpointValues,
						  computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues), numBitsForColorEndpoints);

	// Compute texel weights.

	TexelWeightPair texelWeights[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT];
	computeTexelWeights(&texelWeights[0], blockData, blockWidth, blockHeight, blockMode);

	// Set texel colors.

	const int		ccs						= blockMode.isDualPlane ? (int)blockData.getBits(extraCemBitsStart-2, extraCemBitsStart-1) : -1;
	const deUint32	partitionIndexSeed		= numPartitions > 1 ? blockData.getBits(13, 22) : (deUint32)-1;

	return setTexelColors(dst, &colorEndpoints[0], &texelWeights[0], ccs, partitionIndexSeed, numPartitions, blockWidth, blockHeight, isSRGB, isLDR, &colorEndpointModes[0]);
}